

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<bool,bool,bool,duckdb::BinaryLambdaWrapper,bool,bool(*)(bool,bool),true,false>
               (bool *ldata,bool *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               _func_bool_bool_bool *fun)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  bool bVar3;
  unsigned_long uVar4;
  ValidityMask *in_RCX;
  void *in_RDX;
  void *in_RSI;
  byte *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  bool rentry_2;
  bool lentry_2;
  idx_t i;
  bool rentry_1;
  bool lentry_1;
  idx_t start;
  bool rentry;
  bool lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  ValidityMask *in_stack_ffffffffffffff80;
  ValidityMask *mask_00;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  _func_bool_bool_bool *in_stack_ffffffffffffff90;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  TemplatedValidityMask<unsigned_long> *local_28;
  ValidityMask *local_20;
  void *local_18;
  void *local_10;
  byte *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + (long)in_RCX),in_RDX,
             (void *)((long)in_RDX + (long)in_RCX),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar3) {
    for (mask_00 = (ValidityMask *)0x0; mask_00 < local_20;
        mask_00 = (ValidityMask *)
                  ((long)&(mask_00->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1))
    {
      bVar3 = BinaryLambdaWrapper::Operation<bool(*)(bool,bool),bool,bool,bool,bool>
                        (in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f,
                         (bool)in_stack_ffffffffffffff8e,mask_00,
                         CONCAT17(*local_8,CONCAT16(*(undefined1 *)((long)local_10 + (long)mask_00),
                                                    in_stack_ffffffffffffff78)) & 0x101ffffffffffff)
      ;
      *(bool *)((long)local_18 + (long)mask_00) = bVar3;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x4d340d);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT17(in_stack_ffffffffffffff8f,
                                     CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),
                            (idx_t)in_stack_ffffffffffffff80);
      uVar4 = MinValue<unsigned_long>(local_38 + 0x40,(unsigned_long)local_20);
      bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar3) {
        for (; uVar2 = local_38, local_38 < uVar4; local_38 = local_38 + 1) {
          bVar3 = BinaryLambdaWrapper::Operation<bool(*)(bool,bool),bool,bool,bool,bool>
                            (in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f,
                             (bool)in_stack_ffffffffffffff8e,in_stack_ffffffffffffff80,
                             CONCAT17(in_stack_ffffffffffffff7f,
                                      CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78))
                            );
          *(bool *)((long)local_18 + local_38) = bVar3;
        }
      }
      else {
        bVar3 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        uVar1 = local_38;
        uVar2 = uVar4;
        if (!bVar3) {
          for (; uVar2 = local_38, local_38 < uVar4; local_38 = local_38 + 1) {
            in_stack_ffffffffffffff90 = (_func_bool_bool_bool *)(local_38 - uVar1);
            bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_50,(idx_t *)&stack0xffffffffffffff90);
            if (bVar3) {
              in_stack_ffffffffffffff8f = *local_8 & 1;
              in_stack_ffffffffffffff8e = *(byte *)((long)local_10 + local_38) & 1;
              bVar3 = BinaryLambdaWrapper::Operation<bool(*)(bool,bool),bool,bool,bool,bool>
                                (in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f,
                                 (bool)in_stack_ffffffffffffff8e,in_stack_ffffffffffffff80,
                                 CONCAT17(in_stack_ffffffffffffff7f,
                                          CONCAT16(in_stack_ffffffffffffff7e,
                                                   in_stack_ffffffffffffff78)));
              *(bool *)((long)local_18 + local_38) = bVar3;
            }
          }
        }
      }
      local_38 = uVar2;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}